

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

CharClass<unsigned_char> * __thiscall
Centaurus::CharClass<unsigned_char>::operator|
          (CharClass<unsigned_char> *__return_storage_ptr__,CharClass<unsigned_char> *this,
          CharClass<unsigned_char> *cc)

{
  undefined8 __first;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  *p_Var4;
  reference pRVar5;
  const_iterator __last;
  bool local_131;
  __normal_iterator<Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_100;
  const_iterator local_f8;
  Range<unsigned_char> *local_f0;
  Range<unsigned_char> *local_e8;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_e0;
  __normal_iterator<Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_d8;
  const_iterator local_d0;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_c8;
  Range<unsigned_char> local_c0;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_b0;
  Range<unsigned_char> local_a8;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_98;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_90;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_88;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_80;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_78;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_70;
  undefined1 local_68 [8];
  Range<unsigned_char> rj;
  undefined1 local_48 [8];
  Range<unsigned_char> ri;
  const_iterator j;
  const_iterator i;
  CharClass<unsigned_char> *cc_local;
  CharClass<unsigned_char> *this_local;
  CharClass<unsigned_char> *new_class;
  
  CharClass(__return_storage_ptr__);
  j = std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      cbegin(&this->m_ranges);
  ri._8_8_ = std::
             vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ::cbegin(&cc->m_ranges);
  Range<unsigned_char>::Range((Range<unsigned_char> *)local_48);
  Range<unsigned_char>::Range((Range<unsigned_char> *)local_68);
  local_70._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       cend(&this->m_ranges);
  bVar1 = __gnu_cxx::operator!=(&j,&local_70);
  if (bVar1) {
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator*(&j);
    Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar5);
  }
  local_78._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       cend(&cc->m_ranges);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                      *)&ri.m_start,&local_78);
  if (bVar1) {
    pRVar5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                          *)&ri.m_start);
    Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar5);
  }
  while( true ) {
    local_80._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&j,&local_80);
    local_131 = false;
    if (bVar1) {
      local_88._M_current =
           (Range<unsigned_char> *)
           std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::cend(&cc->m_ranges);
      local_131 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                              *)&ri.m_start,&local_88);
    }
    if (local_131 == false) break;
    bVar1 = Range<unsigned_char>::operator<
                      ((Range<unsigned_char> *)local_48,(Range<unsigned_char> *)local_68);
    if (bVar1) {
      std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      push_back(&__return_storage_ptr__->m_ranges,(value_type *)local_48);
      p_Var4 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator++(&j);
      local_90._M_current =
           (Range<unsigned_char> *)
           std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::cend(&this->m_ranges);
      bVar1 = __gnu_cxx::operator!=(p_Var4,&local_90);
      if (bVar1) {
        pRVar5 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                 ::operator*(&j);
        Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar5);
      }
    }
    else {
      bVar1 = Range<unsigned_char>::operator>
                        ((Range<unsigned_char> *)local_48,(Range<unsigned_char> *)local_68);
      if (bVar1) {
        std::
        vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
        push_back(&__return_storage_ptr__->m_ranges,(value_type *)local_68);
        p_Var4 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                 ::operator++((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                               *)&ri.m_start);
        local_98._M_current =
             (Range<unsigned_char> *)
             std::
             vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ::cend(&cc->m_ranges);
        bVar1 = __gnu_cxx::operator!=(p_Var4,&local_98);
        if (bVar1) {
          pRVar5 = __gnu_cxx::
                   __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                   ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                *)&ri.m_start);
          Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar5);
        }
      }
      else {
        bVar2 = Range<unsigned_char>::end((Range<unsigned_char> *)local_48);
        bVar3 = Range<unsigned_char>::end((Range<unsigned_char> *)local_68);
        if (bVar2 < bVar3) {
          Range<unsigned_char>::merge(&local_a8,(Range<unsigned_char> *)local_68);
          Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,&local_a8);
          Range<unsigned_char>::~Range(&local_a8);
          p_Var4 = __gnu_cxx::
                   __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                   ::operator++(&j);
          local_b0._M_current =
               (Range<unsigned_char> *)
               std::
               vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ::cend(&this->m_ranges);
          bVar1 = __gnu_cxx::operator!=(p_Var4,&local_b0);
          if (bVar1) {
            pRVar5 = __gnu_cxx::
                     __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                     ::operator*(&j);
            Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,pRVar5);
          }
        }
        else {
          Range<unsigned_char>::merge(&local_c0,(Range<unsigned_char> *)local_48);
          Range<unsigned_char>::operator=((Range<unsigned_char> *)local_48,&local_c0);
          Range<unsigned_char>::~Range(&local_c0);
          p_Var4 = __gnu_cxx::
                   __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                   ::operator++((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                 *)&ri.m_start);
          local_c8._M_current =
               (Range<unsigned_char> *)
               std::
               vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
               ::cend(&cc->m_ranges);
          bVar1 = __gnu_cxx::operator!=(p_Var4,&local_c8);
          if (bVar1) {
            pRVar5 = __gnu_cxx::
                     __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                     ::operator*((__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                  *)&ri.m_start);
            Range<unsigned_char>::operator=((Range<unsigned_char> *)local_68,pRVar5);
          }
        }
      }
    }
  }
  local_d8._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       end(&__return_storage_ptr__->m_ranges);
  __gnu_cxx::
  __normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>
  ::__normal_iterator<Centaurus::Range<unsigned_char>*>
            ((__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>
              *)&local_d0,&local_d8);
  local_e0._M_current = j._M_current;
  local_e8 = (Range<unsigned_char> *)
             std::
             vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
             ::cend(&this->m_ranges);
  local_f0 = (Range<unsigned_char> *)
             std::
             vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
             ::
             insert<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,void>
                       ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
                         *)&__return_storage_ptr__->m_ranges,local_d0,local_e0,
                        (__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                         )local_e8);
  local_100._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       end(&__return_storage_ptr__->m_ranges);
  __gnu_cxx::
  __normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>
  ::__normal_iterator<Centaurus::Range<unsigned_char>*>
            ((__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>
              *)&local_f8,&local_100);
  __first = ri._8_8_;
  __last = std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::cend(&cc->m_ranges);
  std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>::
  insert<__gnu_cxx::__normal_iterator<Centaurus::Range<unsigned_char>const*,std::vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>>,void>
            ((vector<Centaurus::Range<unsigned_char>,std::allocator<Centaurus::Range<unsigned_char>>>
              *)&__return_storage_ptr__->m_ranges,local_f8,
             (__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
              )__first,
             (__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
              )__last._M_current);
  Range<unsigned_char>::~Range((Range<unsigned_char> *)local_68);
  Range<unsigned_char>::~Range((Range<unsigned_char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> CharClass<TCHAR>::operator|(const CharClass<TCHAR>& cc) const
{
    CharClass<TCHAR> new_class;

    auto i = m_ranges.cbegin();
    auto j = cc.m_ranges.cbegin();

    Range<TCHAR> ri, rj;

    if (i != m_ranges.cend()) ri = *i;
    if (j != cc.m_ranges.cend()) rj = *j;

    while (i != m_ranges.cend() && j != cc.m_ranges.cend())
    {
        if (ri < rj)
        {
            new_class.m_ranges.push_back(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        else if (ri > rj)
        {
            new_class.m_ranges.push_back(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }
        else
        {
            if (ri.end() < rj.end())
            {
                rj = rj.merge(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else
            {
                ri = ri.merge(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
        }
    }

    new_class.m_ranges.insert(new_class.m_ranges.end(), i, m_ranges.cend());
    new_class.m_ranges.insert(new_class.m_ranges.end(), j, cc.m_ranges.cend());

    return new_class;
}